

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

void __thiscall spvtools::Optimizer::SetMessageConsumer(Optimizer *this,MessageConsumer *c)

{
  pointer puVar1;
  unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_> uVar2;
  _Manager_type p_Var3;
  pointer puVar4;
  ulong uVar5;
  _Head_base<0UL,_spvtools::Optimizer::Impl_*,_false> _Var6;
  ulong uVar7;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type local_70;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  spv_position_t local_40;
  
  _Var6._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
  puVar4 = *(pointer *)
            &((vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
               *)((long)&(_Var6._M_head_impl)->pass_manager + 0x20))->
             super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
  ;
  puVar1 = *(pointer *)((long)&(_Var6._M_head_impl)->pass_manager + 0x28);
  if ((int)((ulong)((long)puVar1 - (long)puVar4) >> 3) != 0) {
    if (puVar1 != puVar4) {
      uVar7 = 0;
      do {
        uVar2._M_t.
        super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>.
        super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl = puVar4[uVar7]._M_t;
        local_58 = (_Manager_type)0x0;
        p_Stack_50 = (_Invoker_type)0x0;
        local_68._M_unused._M_object = (void *)0x0;
        local_68._8_8_ = 0;
        p_Var3 = (c->super__Function_base)._M_manager;
        if (p_Var3 != (_Manager_type)0x0) {
          (*p_Var3)(&local_68,(_Any_data *)c,__clone_functor);
          p_Stack_50 = c->_M_invoker;
          local_58 = (c->super__Function_base)._M_manager;
        }
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        operator=((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                   *)((long)uVar2._M_t.
                            super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
                            .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl + 8),
                  (function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                   *)&local_68);
        if (local_58 != (_Manager_type)0x0) {
          (*local_58)(&local_68,&local_68,__destroy_functor);
        }
        _Var6._M_head_impl =
             (this->impl_)._M_t.
             super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
             .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
        puVar4 = *(pointer *)
                  &(((vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
                      *)((long)&(_Var6._M_head_impl)->pass_manager + 0x20))->
                   super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
                   )._M_impl;
        uVar5 = (long)*(pointer *)((long)&(_Var6._M_head_impl)->pass_manager + 0x28) - (long)puVar4;
        if ((uint)(uVar5 >> 3) <= (int)uVar7 + 1U) goto LAB_004e721a;
        uVar7 = uVar7 + 1;
      } while (uVar7 < (ulong)((long)uVar5 >> 3));
    }
    local_40.line = 0x93;
    local_40.column = 0;
    local_40.index = 0;
    Log(&((_Var6._M_head_impl)->pass_manager).consumer_,SPV_MSG_INTERNAL_ERROR,
        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/pass_manager.h"
        ,&local_40,"assertion failed: index out of bound");
    exit(1);
  }
LAB_004e721a:
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (_Manager_type)0x0;
  local_70 = c->_M_invoker;
  p_Var3 = (c->super__Function_base)._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    local_88._M_unused._0_8_ = (undefined8)*(undefined8 *)&(c->super__Function_base)._M_functor;
    local_88._8_8_ = *(undefined8 *)((long)&(c->super__Function_base)._M_functor + 8);
    (c->super__Function_base)._M_manager = (_Manager_type)0x0;
    c->_M_invoker = (_Invoker_type)0x0;
    local_78 = p_Var3;
  }
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  operator=(&((_Var6._M_head_impl)->pass_manager).consumer_,
            (function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
             *)&local_88);
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  return;
}

Assistant:

void Optimizer::SetMessageConsumer(MessageConsumer c) {
  // All passes' message consumer needs to be updated.
  for (uint32_t i = 0; i < impl_->pass_manager.NumPasses(); ++i) {
    impl_->pass_manager.GetPass(i)->SetMessageConsumer(c);
  }
  impl_->pass_manager.SetMessageConsumer(std::move(c));
}